

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateShutdownCode
          (MessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  FieldGenerator *pFVar2;
  int i;
  long lVar3;
  long lVar4;
  string local_48;
  
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x6b) == '\0') {
    io::Printer::Print(printer,"_$classname$_default_instance_.Shutdown();\n","classname",
                       &this->classname_);
    if (((this->options_).enforce_lite == false) &&
       (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) != 3)) {
      SimpleItoa_abi_cxx11_(&local_48,(protobuf *)(ulong)(uint)this->index_in_file_messages_,i);
      io::Printer::Print(printer,"delete file_level_metadata[$index$].reflection;\n","index",
                         &local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    pDVar1 = this->descriptor_;
    if (0 < *(int *)(pDVar1 + 0x2c)) {
      lVar3 = 0;
      lVar4 = 0;
      do {
        pFVar2 = FieldGeneratorMap::get
                           (&this->field_generators_,
                            (FieldDescriptor *)(*(long *)(pDVar1 + 0x30) + lVar3));
        (*pFVar2->_vptr_FieldGenerator[0x12])(pFVar2,printer);
        lVar4 = lVar4 + 1;
        pDVar1 = this->descriptor_;
        lVar3 = lVar3 + 0xa8;
      } while (lVar4 < *(int *)(pDVar1 + 0x2c));
    }
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateShutdownCode(io::Printer* printer) {
  if (IsMapEntryMessage(descriptor_)) return;

  printer->Print("_$classname$_default_instance_.Shutdown();\n", "classname",
                 classname_);

  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    printer->Print("delete file_level_metadata[$index$].reflection;\n", "index",
                   SimpleItoa(index_in_file_messages_));
  }

  // Handle default instances of fields.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
                     .GenerateShutdownCode(printer);
  }
}